

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

void Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
               (ImageTemplate<unsigned_char> *image1,uint32_t startX1,uint32_t startY1,
               ImageTemplate<unsigned_char> *image2,uint32_t startX2,uint32_t startY2,
               ImageTemplate<unsigned_char> *image3,uint32_t startX3,uint32_t startY3,uint32_t width
               ,uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined8 uVar4;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  ImageTemplate<unsigned_char> *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint in_stack_00000020;
  uint in_stack_00000028;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffd8;
  
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  if (((((((!bVar1) && (bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RCX), !bVar1)
          ) && (bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_stack_00000008),
               !bVar1)) &&
        ((bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                            (in_stack_ffffffffffffffb0), bVar1 &&
         (bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                            (in_stack_ffffffffffffffb0), bVar1)))) &&
       (((bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                            (in_stack_ffffffffffffffb0), bVar1 &&
         ((in_stack_00000020 != 0 && (in_stack_00000028 != 0)))) &&
        (uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI),
        in_ESI + in_stack_00000020 <= uVar2)))) &&
      ((((uVar3 = in_EDX + in_stack_00000028,
         uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI), uVar3 <= uVar2 &&
         (in_stack_00000020 <= in_ESI + in_stack_00000020)) &&
        (in_stack_00000028 <= in_EDX + in_stack_00000028)) &&
       (((uVar3 = in_R8D + in_stack_00000020,
         uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RCX), uVar3 <= uVar2 &&
         (uVar3 = in_R9D + in_stack_00000028,
         uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RCX), uVar3 <= uVar2)) &&
        ((in_stack_00000020 <= in_R8D + in_stack_00000020 &&
         ((in_stack_00000028 <= in_R9D + in_stack_00000028 &&
          (uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_stack_00000008),
          in_stack_00000010 + in_stack_00000020 <= uVar2)))))))))) &&
     ((uVar3 = in_stack_00000018 + in_stack_00000028,
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_stack_00000008),
      uVar3 <= uVar2 &&
      ((in_stack_00000020 <= in_stack_00000010 + in_stack_00000020 &&
       (in_stack_00000028 <= in_stack_00000018 + in_stack_00000028)))))) {
    return;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException
            ((imageException *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd8);
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ParameterValidation( const TImage & image1, uint32_t startX1, uint32_t startY1,
                              const TImage & image2, uint32_t startX2, uint32_t startY2,
                              const TImage & image3, uint32_t startX3, uint32_t startY3,
                              uint32_t width, uint32_t height )
    {
        if( image1.empty() || image2.empty() || image3.empty() || !IsCorrectColorCount( image1 ) || !IsCorrectColorCount( image2 ) ||
            !IsCorrectColorCount( image3 ) || width == 0 || height == 0 ||
            startX1 + width > image1.width() || startY1 + height > image1.height() || startX1 + width < width || startY1 + height < height ||
            startX2 + width > image2.width() || startY2 + height > image2.height() || startX2 + width < width || startY2 + height < height ||
            startX3 + width > image3.width() || startY3 + height > image3.height() || startX3 + width < width || startY3 + height < height )
            throw imageException( "Bad input parameters in image function" );
    }